

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::InterInvocationTestCase::init
          (InterInvocationTestCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *this_00;
  pointer *ppiVar1;
  int iVar2;
  int iVar3;
  RenderContext *renderCtx;
  bool bVar4;
  int iVar5;
  ContextType ctxType;
  deUint32 dVar6;
  int extraout_EAX;
  undefined4 extraout_var;
  ShaderProgram *this_01;
  ProgramSources *sources;
  MessageBuilder *this_02;
  TestError *this_03;
  NotSupportedError *this_04;
  vector<unsigned_int,_std::allocator<unsigned_int>_> zeroBuffer;
  string local_1d0;
  vector<int,_std::allocator<int>_> zeroBuffer_1;
  long lVar7;
  
  iVar5 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar5);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar4 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (((!bVar4) && (this->m_useAtomic != false)) && (this->m_storage == STORAGE_IMAGE)) {
    bVar4 = glu::ContextInfo::isExtensionSupported
                      (((this->super_TestCase).m_context)->m_contextInfo,
                       "GL_OES_shader_image_atomic");
    if (!bVar4) {
      this_04 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&zeroBuffer_1,"Test requires GL_OES_shader_image_atomic extension",
                 (allocator<char> *)&zeroBuffer);
      tcu::NotSupportedError::NotSupportedError(this_04,(string *)&zeroBuffer_1);
      __cxa_throw(this_04,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  this_01 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&zeroBuffer_1,0,0xac);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&local_1d0,this);
  glu::ComputeSource::ComputeSource((ComputeSource *)&zeroBuffer,&local_1d0);
  sources = glu::ProgramSources::operator<<
                      ((ProgramSources *)&zeroBuffer_1,(ShaderSource *)&zeroBuffer);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,sources);
  this->m_program = this_01;
  std::__cxx11::string::~string
            ((string *)
             &zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&local_1d0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&zeroBuffer_1);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  if ((this->m_program->m_program).m_info.linkOk != false) {
    if (this->m_storage == STORAGE_IMAGE) {
      iVar5 = this->m_workWidth;
      iVar2 = this->m_workHeight;
      iVar3 = this->m_elementsPerInvocation;
      zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      ppiVar1 = &zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppiVar1);
      std::operator<<((ostream *)ppiVar1,"Allocating image for storage, size ");
      this_02 = tcu::MessageBuilder::operator<<((MessageBuilder *)&zeroBuffer_1,&this->m_workWidth);
      this_00 = &this_02->m_str;
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,"x");
      std::ostream::operator<<(this_00,this->m_elementsPerInvocation * this->m_workHeight);
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,", ");
      std::ostream::operator<<(this_00,iVar5 * iVar2 * iVar3 * 4);
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>," bytes.");
      tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppiVar1);
      (**(code **)(lVar7 + 0x6f8))(1,&this->m_storageTex);
      (**(code **)(lVar7 + 0xb8))(0xde1,this->m_storageTex);
      (**(code **)(lVar7 + 0x1380))
                (0xde1,1,0x8235,this->m_workWidth,this->m_elementsPerInvocation * this->m_workHeight
                );
      (**(code **)(lVar7 + 0x1360))(0xde1,0x2801,0x2600);
      (**(code **)(lVar7 + 0x1360))(0xde1,0x2800,0x2600);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"gen storage image",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                      ,0xf8);
      zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      ppiVar1 = &zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppiVar1);
      std::operator<<((ostream *)ppiVar1,"Filling image with 0.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&zeroBuffer_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppiVar1);
      zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start._0_4_ = 0;
      std::vector<int,_std::allocator<int>_>::vector
                (&zeroBuffer_1,
                 (long)(this->m_workHeight * this->m_workWidth * this->m_elementsPerInvocation),
                 (value_type_conflict1 *)&zeroBuffer,(allocator_type *)&local_1d0);
      (**(code **)(lVar7 + 0x13b8))
                (0xde1,0,0,0,this->m_workWidth,this->m_elementsPerInvocation * this->m_workHeight,
                 0x8d94,0x1404,
                 zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"specify image contents",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                      ,0x100);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>);
    }
    else if (this->m_storage == STORAGE_BUFFER) {
      iVar5 = this->m_workHeight * this->m_workWidth * this->m_elementsPerInvocation;
      zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((ulong)zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl
                                  .super__Vector_impl_data._M_start & 0xffffffff00000000);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                (&zeroBuffer,(long)iVar5,(value_type_conflict4 *)&zeroBuffer_1,
                 (allocator_type *)&local_1d0);
      zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      ppiVar1 = &zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppiVar1);
      std::operator<<((ostream *)ppiVar1,"Allocating zero-filled buffer for storage, size ");
      std::ostream::operator<<(ppiVar1,iVar5);
      std::operator<<((ostream *)ppiVar1," elements, ");
      std::ostream::operator<<(ppiVar1,iVar5 * 4);
      std::operator<<((ostream *)ppiVar1," bytes.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&zeroBuffer_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppiVar1);
      (**(code **)(lVar7 + 0x6c8))(1,&this->m_storageBuf);
      (**(code **)(lVar7 + 0x40))(0x90d2,this->m_storageBuf);
      (**(code **)(lVar7 + 0x150))
                (0x90d2,(long)(iVar5 * 4),
                 CONCAT44(zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start._4_4_,
                          zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                          ._M_impl.super__Vector_impl_data._M_start._0_4_),0x88e4);
      dVar6 = (**(code **)(lVar7 + 0x800))();
      glu::checkError(dVar6,"gen storage buf",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                      ,0xea);
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    }
    iVar5 = this->m_workHeight * this->m_workWidth;
    zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)CONCAT44(zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,0xffffffff);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&zeroBuffer,(long)iVar5,
               (value_type_conflict1 *)&zeroBuffer_1,(allocator_type *)&local_1d0);
    zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppiVar1 = &zeroBuffer_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppiVar1);
    std::operator<<((ostream *)ppiVar1,"Allocating -1 filled buffer for results, size ");
    std::ostream::operator<<(ppiVar1,iVar5);
    std::operator<<((ostream *)ppiVar1," elements, ");
    std::ostream::operator<<(ppiVar1,iVar5 * 4);
    std::operator<<((ostream *)ppiVar1," bytes.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&zeroBuffer_1,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppiVar1);
    (**(code **)(lVar7 + 0x6c8))(1,&this->m_resultBuf);
    (**(code **)(lVar7 + 0x40))(0x90d2,this->m_resultBuf);
    (**(code **)(lVar7 + 0x150))
              (0x90d2,(long)(iVar5 * 4),
               CONCAT44(zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_,
                        zeroBuffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._0_4_),0x88e4);
    dVar6 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar6,"gen storage buf",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x112);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&zeroBuffer);
    return extraout_EAX;
  }
  this_03 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&zeroBuffer_1,"could not build program",(allocator<char> *)&zeroBuffer);
  tcu::TestError::TestError(this_03,(string *)&zeroBuffer_1);
  __cxa_throw(this_03,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void InterInvocationTestCase::init (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const bool				supportsES32	= glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	// requirements

	if (m_useAtomic && m_storage == STORAGE_IMAGE && !supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_OES_shader_image_atomic"))
		throw tcu::NotSupportedError("Test requires GL_OES_shader_image_atomic extension");

	// program

	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::ComputeSource(genShaderSource()));
	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		throw tcu::TestError("could not build program");

	// source

	if (m_storage == STORAGE_BUFFER)
	{
		const int				bufferElements	= m_workWidth * m_workHeight * m_elementsPerInvocation;
		const int				bufferSize		= bufferElements * (int)sizeof(deUint32);
		std::vector<deUint32>	zeroBuffer		(bufferElements, 0);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating zero-filled buffer for storage, size " << bufferElements << " elements, " << bufferSize << " bytes." << tcu::TestLog::EndMessage;

		gl.genBuffers(1, &m_storageBuf);
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_storageBuf);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, &zeroBuffer[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen storage buf");
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		const int				bufferElements	= m_workWidth * m_workHeight * m_elementsPerInvocation;
		const int				bufferSize		= bufferElements * (int)sizeof(deUint32);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating image for storage, size " << m_workWidth << "x" << m_workHeight * m_elementsPerInvocation << ", " << bufferSize << " bytes." << tcu::TestLog::EndMessage;

		gl.genTextures(1, &m_storageTex);
		gl.bindTexture(GL_TEXTURE_2D, m_storageTex);
		gl.texStorage2D(GL_TEXTURE_2D, 1, GL_R32I, m_workWidth, m_workHeight * m_elementsPerInvocation);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen storage image");

		// Zero-fill
		m_testCtx.getLog() << tcu::TestLog::Message << "Filling image with 0." << tcu::TestLog::EndMessage;

		{
			const std::vector<deInt32> zeroBuffer(m_workWidth * m_workHeight * m_elementsPerInvocation, 0);
			gl.texSubImage2D(GL_TEXTURE_2D, 0, 0, 0, m_workWidth, m_workHeight * m_elementsPerInvocation, GL_RED_INTEGER, GL_INT, &zeroBuffer[0]);
			GLU_EXPECT_NO_ERROR(gl.getError(), "specify image contents");
		}
	}
	else
		DE_ASSERT(DE_FALSE);

	// destination

	{
		const int				bufferElements	= m_workWidth * m_workHeight;
		const int				bufferSize		= bufferElements * (int)sizeof(deUint32);
		std::vector<deInt32>	negativeBuffer	(bufferElements, -1);

		m_testCtx.getLog() << tcu::TestLog::Message << "Allocating -1 filled buffer for results, size " << bufferElements << " elements, " << bufferSize << " bytes." << tcu::TestLog::EndMessage;

		gl.genBuffers(1, &m_resultBuf);
		gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, m_resultBuf);
		gl.bufferData(GL_SHADER_STORAGE_BUFFER, bufferSize, &negativeBuffer[0], GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "gen storage buf");
	}
}